

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O3

string * __thiscall
iDynTree::XMLAttribute::description_abi_cxx11_(string *__return_storage_ptr__,XMLAttribute *this)

{
  size_type sVar1;
  ostream *poVar2;
  ostringstream str;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  sVar1 = (this->m_prefix)._M_string_length;
  if (sVar1 != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->m_prefix)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->m_name)._M_dataplus._M_p,
                      (this->m_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->m_value)._M_dataplus._M_p,(this->m_value)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string XMLAttribute::description() const
    {
        std::ostringstream str;
        if (!m_prefix.empty()) {
            str << m_prefix << ":";
        }
        str << m_name << "=" << "\"" << m_value <<"\"";
        return str.str();
    }